

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall
cnn::Model::save<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_2)

{
  uint uVar1;
  int nlp;
  int np;
  int local_20;
  int local_1c;
  
  local_1c = (int)((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 3);
  local_20 = (int)((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30)) >> 3);
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_1c);
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_20);
  uVar1 = 0;
  while( true ) {
    if ((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3) <= (ulong)uVar1) break;
    boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
    invoke<cnn::Parameters>(ar,*(Parameters **)(*(long *)(this + 0x18) + (ulong)uVar1 * 8));
    uVar1 = uVar1 + 1;
  }
  uVar1 = 0;
  while( true ) {
    if ((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30) >> 3) <= (ulong)uVar1) break;
    boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::save_standard::
    invoke<cnn::LookupParameters>
              (ar,*(LookupParameters **)(*(long *)(this + 0x30) + (ulong)uVar1 * 8));
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    int np = params.size();
    int nlp = lookup_params.size();
    ar & np;
    ar & nlp;
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
  }